

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  undefined4 extraout_var;
  uint uVar3;
  int old;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  pcVar2 = ReadSizeAndPushLimitAndDepth(this,ptr,&local_14);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = (*msg->_vptr_MessageLite[10])(msg,pcVar2,this);
    pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  }
  this->depth_ = this->depth_ + 1;
  if ((this->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
    uVar3 = (this->super_EpsCopyInputStream).limit_ + local_14;
    (this->super_EpsCopyInputStream).limit_ = uVar3;
    (this->super_EpsCopyInputStream).limit_end_ =
         (this->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar3 >> 0x1f & uVar3);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* ParseContext::ParseMessage(MessageLite* msg, const char* ptr) {
  int old;
  ptr = ReadSizeAndPushLimitAndDepth(ptr, &old);
  ptr = ptr ? msg->_InternalParse(ptr, this) : nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}